

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

int __thiscall QFutureInterfaceBase::progressMinimum(QFutureInterfaceBase *this)

{
  long lVar1;
  bool bVar2;
  ProgressData *pPVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> lock;
  QMutex *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  bVar2 = QScopedPointer::operator_cast_to_bool
                    ((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                      *)0x6dd334);
  if (bVar2) {
    pPVar3 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
             ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                           *)(*(long *)(in_RDI + 8) + 200));
    iVar4 = pPVar3->minimum;
  }
  else {
    iVar4 = 0;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)CONCAT44(iVar4,iVar4));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QFutureInterfaceBase::progressMinimum() const
{
    const QMutexLocker lock(&d->m_mutex);
    return d->m_progress ? d->m_progress->minimum : 0;
}